

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

int __thiscall
ON_BinaryArchive::Internal_Read3dmTextStyle(ON_BinaryArchive *this,ON_TextStyle **ppTextStyle)

{
  bool bVar1;
  int iVar2;
  ON_Object *local_40;
  ON_Object *p;
  ON_TextStyle *text_style;
  ON__INT64 big_value;
  ON_TextStyle **ppOStack_20;
  ON__UINT32 tcode;
  ON_TextStyle **ppTextStyle_local;
  ON_BinaryArchive *this_local;
  
  ppOStack_20 = ppTextStyle;
  ppTextStyle_local = (ON_TextStyle **)this;
  bVar1 = Read3dmTableRecord(this,text_style_table,ppTextStyle);
  if (bVar1) {
    big_value._4_4_ = 0;
    text_style = (ON_TextStyle *)0x0;
    p = (ON_Object *)0x0;
    bVar1 = BeginRead3dmBigChunk(this,(uint *)((long)&big_value + 4),(ON__INT64 *)&text_style);
    if (bVar1) {
      if (big_value._4_4_ == 0x20008074) {
        Internal_Increment3dmTableItemCount(this);
        local_40 = (ON_Object *)0x0;
        iVar2 = ReadObject(this,&local_40);
        if (iVar2 != 0) {
          p = (ON_Object *)ON_TextStyle::Cast(local_40);
          if ((ON_TextStyle *)p == (ON_TextStyle *)0x0) {
            if (local_40 != (ON_Object *)0x0) {
              (*local_40->_vptr_ON_Object[4])();
            }
          }
          else {
            Internal_Read3dmUpdateManifest(this,(ON_ModelComponent *)p);
          }
        }
        if (p == (ON_Object *)0x0) {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                     ,0x299b,"","ON_BinaryArchive::Read3dmTextStyle() - corrupt text_style table");
        }
      }
      else if (big_value._4_4_ != -1) {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                   ,0x299f,"","ON_BinaryArchive::Read3dmTextStyle() - corrupt text_style table");
      }
      EndRead3dmChunk(this);
    }
    *ppOStack_20 = (ON_TextStyle *)p;
    this_local._4_4_ = (uint)(p != (ON_Object *)0x0);
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int ON_BinaryArchive::Internal_Read3dmTextStyle( ON_TextStyle** ppTextStyle )
{
  if ( false == Read3dmTableRecord(ON_3dmArchiveTableType::text_style_table, (void**)ppTextStyle))
    return 0;

  ON__UINT32 tcode = 0;
  ON__INT64 big_value = 0;
  ON_TextStyle* text_style = nullptr;
  if ( BeginRead3dmBigChunk( &tcode, &big_value ) ) 
  {
    if ( tcode == TCODE_FONT_RECORD )
    {
      Internal_Increment3dmTableItemCount();
      ON_Object* p = 0;
      if ( ReadObject( &p ) ) 
      {
        text_style = ON_TextStyle::Cast(p);
        if ( !text_style )
          delete p;
        else
        {
          Internal_Read3dmUpdateManifest(*text_style);
        }
      }
      if (!text_style) {
        ON_ERROR("ON_BinaryArchive::Read3dmTextStyle() - corrupt text_style table");
      }
    }
    else if ( tcode != TCODE_ENDOFTABLE ) {
      ON_ERROR("ON_BinaryArchive::Read3dmTextStyle() - corrupt text_style table");
    }
    EndRead3dmChunk();
  }
  *ppTextStyle = text_style;
  return (text_style) ? 1 : 0;
}